

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

bool __thiscall
QPDFWriter::willFilterStream
          (QPDFWriter *this,QPDFObjectHandle *stream,bool *compress_stream,bool *is_root_metadata,
          string *stream_data)

{
  qpdf_stream_decode_level_e decode_level;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  uint encode_flags;
  element_type *peVar4;
  long lVar5;
  bool bVar6;
  bool local_109;
  uint local_fc;
  undefined2 local_ea;
  string local_e8;
  bool *local_c8;
  PipelinePopper pp_stream_data;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_b0;
  string local_a8;
  QPDFObjectHandle filter_obj;
  QPDFObjectHandle stream_dict;
  QPDFObjGen old_og;
  
  *compress_stream = false;
  *is_root_metadata = false;
  local_c8 = compress_stream;
  old_og = QPDFObjectHandle::getObjGen(stream);
  QPDFObjectHandle::getDict(&stream_dict);
  bVar1 = QPDFObjectHandle::isRootMetadata(stream);
  if (bVar1) {
    *is_root_metadata = true;
  }
  bVar1 = QPDFObjectHandle::isDataModified(stream);
  bVar6 = true;
  if ((!bVar1) &&
     (peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar4->compress_streams == false)) {
    bVar6 = peVar4->stream_decode_level != qpdf_dl_none;
  }
  bVar1 = QPDFObjectHandle::getFilterOnWrite(stream);
  local_109 = true;
  if (!bVar1) {
    local_fc = 0;
    bVar6 = false;
    goto LAB_001b7711;
  }
  peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4->compress_streams == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"/Filter",(allocator<char> *)&local_a8);
    QPDFObjectHandle::getKey(&filter_obj,(string *)&stream_dict);
    std::__cxx11::string::~string((string *)&local_e8);
    if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        recompress_flate == false) {
      bVar1 = QPDFObjectHandle::isDataModified(stream);
      if (!bVar1) {
        bVar1 = QPDFObjectHandle::isName(&filter_obj);
        if (bVar1) {
          QPDFObjectHandle::getName_abi_cxx11_(&local_e8,&filter_obj);
          bVar1 = std::operator==(&local_e8,"/FlateDecode");
          if (bVar1) {
            bVar1 = false;
          }
          else {
            QPDFObjectHandle::getName_abi_cxx11_(&local_a8,&filter_obj);
            bVar2 = std::operator==(&local_a8,"/Fl");
            std::__cxx11::string::~string((string *)&local_a8);
            bVar1 = false;
            if (!bVar2) {
              bVar1 = bVar6;
            }
          }
          bVar6 = bVar1;
          std::__cxx11::string::~string((string *)&local_e8);
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&filter_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (*is_root_metadata == true) {
    bVar1 = true;
    bVar2 = false;
    if ((peVar4->encrypted == true) && (bVar2 = false, peVar4->encrypt_metadata != false))
    goto LAB_001b76a4;
  }
  else {
LAB_001b76a4:
    if (peVar4->normalize_content == true) {
      sVar3 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                        (&peVar4->normalized_streams,&old_og);
      if (sVar3 != 0) {
        local_109 = true;
        local_fc = 2;
        bVar6 = true;
        goto LAB_001b7711;
      }
    }
    if (bVar6 == false) {
      local_fc = 0;
      goto LAB_001b7711;
    }
    local_fc = 0;
    local_109 = true;
    bVar1 = bVar6;
    bVar2 = true;
    if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        compress_streams != true) goto LAB_001b7711;
  }
  local_109 = bVar2;
  bVar6 = bVar1;
  *local_c8 = local_109;
  local_fc = 0;
LAB_001b7711:
  local_ea = 1;
  lVar5 = 0;
  do {
    if (lVar5 == 2) {
LAB_001b78dd:
      *local_c8 = false;
      bVar6 = false;
LAB_001b78e8:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&stream_dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return bVar6;
    }
    pp_stream_data.stack_id = 0;
    bVar1 = *(bool *)((long)&local_ea + lVar5);
    pp_stream_data.qw = this;
    if (stream_data == (string *)0x0) {
      local_b0._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
           (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
           (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
      activatePipelineStack
                (this,&pp_stream_data,true,(string *)0x0,
                 (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_b0);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_b0);
    }
    else {
      activatePipelineStack(this,&pp_stream_data,stream_data);
    }
    peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    encode_flags = *local_c8 | local_fc;
    if (bVar6 == false) {
      encode_flags = 0;
    }
    if ((bVar6 & local_109) == 1) {
      decode_level = peVar4->stream_decode_level;
    }
    else {
      decode_level = (uint)bVar6 * 3;
    }
    bVar1 = QPDFObjectHandle::pipeStreamData
                      (stream,&peVar4->pipeline->super_Pipeline,encode_flags,decode_level,false,
                       bVar1);
    if (bVar6 != true || bVar1) {
      PipelinePopper::~PipelinePopper(&pp_stream_data);
      bVar6 = true;
      if (bVar1) goto LAB_001b78e8;
      goto LAB_001b78dd;
    }
    QPDFObjectHandle::setFilterOnWrite(stream,false);
    if (stream_data != (string *)0x0) {
      stream_data->_M_string_length = 0;
      *(stream_data->_M_dataplus)._M_p = '\0';
    }
    PipelinePopper::~PipelinePopper(&pp_stream_data);
    lVar5 = lVar5 + 1;
    bVar6 = false;
  } while( true );
}

Assistant:

bool
QPDFWriter::willFilterStream(
    QPDFObjectHandle stream,
    bool& compress_stream,  // out only
    bool& is_root_metadata, // out only
    std::string* stream_data)
{
    compress_stream = false;
    is_root_metadata = false;

    QPDFObjGen old_og = stream.getObjGen();
    QPDFObjectHandle stream_dict = stream.getDict();

    if (stream.isRootMetadata()) {
        is_root_metadata = true;
    }
    bool filter = stream.isDataModified() || m->compress_streams || m->stream_decode_level;
    bool filter_on_write = stream.getFilterOnWrite();
    if (!filter_on_write) {
        QTC::TC("qpdf", "QPDFWriter getFilterOnWrite false");
        filter = false;
    }
    if (filter_on_write && m->compress_streams) {
        // Don't filter if the stream is already compressed with FlateDecode. This way we don't make
        // it worse if the original file used a better Flate algorithm, and we don't spend time and
        // CPU cycles uncompressing and recompressing stuff. This can be overridden with
        // setRecompressFlate(true).
        QPDFObjectHandle filter_obj = stream_dict.getKey("/Filter");
        if (!m->recompress_flate && !stream.isDataModified() && filter_obj.isName() &&
            (filter_obj.getName() == "/FlateDecode" || filter_obj.getName() == "/Fl")) {
            QTC::TC("qpdf", "QPDFWriter not recompressing /FlateDecode");
            filter = false;
        }
    }
    bool normalize = false;
    bool uncompress = false;
    if (filter_on_write && is_root_metadata && (!m->encrypted || !m->encrypt_metadata)) {
        QTC::TC("qpdf", "QPDFWriter not compressing metadata");
        filter = true;
        compress_stream = false;
        uncompress = true;
    } else if (filter_on_write && m->normalize_content && m->normalized_streams.count(old_og)) {
        normalize = true;
        filter = true;
    } else if (filter_on_write && filter && m->compress_streams) {
        compress_stream = true;
        QTC::TC("qpdf", "QPDFWriter compressing uncompressed stream");
    }

    bool filtered = false;
    for (bool first_attempt: {true, false}) {
        PipelinePopper pp_stream_data(this);
        if (stream_data != nullptr) {
            activatePipelineStack(pp_stream_data, *stream_data);
        } else {
            activatePipelineStack(pp_stream_data, true);
        }
        try {
            filtered = stream.pipeStreamData(
                m->pipeline,
                !filter ? 0
                        : ((normalize ? qpdf_ef_normalize : 0) |
                           (compress_stream ? qpdf_ef_compress : 0)),
                !filter ? qpdf_dl_none : (uncompress ? qpdf_dl_all : m->stream_decode_level),
                false,
                first_attempt);
            if (filter && !filtered) {
                // Try again
                filter = false;
                stream.setFilterOnWrite(false);
            } else {
                break;
            }
        } catch (std::runtime_error& e) {
            if (filter && first_attempt) {
                stream.warnIfPossible("error while getting stream data: "s + e.what());
                stream.warnIfPossible("qpdf will attempt to write the damaged stream unchanged");
                filter = false;
                stream.setFilterOnWrite(false);
                continue;
            }
            throw std::runtime_error(
                "error while getting stream data for " + stream.unparse() + ": " + e.what());
        }
        if (stream_data) {
            stream_data->clear();
        }
    }
    if (!filtered) {
        compress_stream = false;
    }
    return filtered;
}